

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_LRP(Context *ctx)

{
  char local_158 [8];
  char code [128];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  Context *ctx_local;
  
  make_GLSL_srcarg_string_masked(ctx,0,src1 + 0x38,0x40);
  make_GLSL_srcarg_string_masked(ctx,1,src2 + 0x38,0x40);
  make_GLSL_srcarg_string_masked(ctx,2,code + 0x78,0x40);
  make_GLSL_destarg_assign(ctx,local_158,0x80,"mix(%s, %s, %s)",code + 0x78,src2 + 0x38,src1 + 0x38)
  ;
  output_line(ctx,"%s",local_158);
  return;
}

Assistant:

static void emit_GLSL_LRP(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_GLSL_srcarg_string_masked(ctx, 2, src2, sizeof (src2));
    char code[128];
    make_GLSL_destarg_assign(ctx, code, sizeof (code), "mix(%s, %s, %s)",
                             src2, src1, src0);
    output_line(ctx, "%s", code);
}